

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O0

btScalar __thiscall btLCP::AiN_times_qN(btLCP *this,int i,btScalar *q)

{
  long in_RDX;
  int in_ESI;
  long in_RDI;
  btScalar bVar1;
  
  bVar1 = btLargeDot((btScalar *)
                     (*(long *)(*(long *)(in_RDI + 0x18) + (long)in_ESI * 8) +
                     (long)*(int *)(in_RDI + 0xc) * 4),
                     (btScalar *)(in_RDX + (long)*(int *)(in_RDI + 0xc) * 4),*(int *)(in_RDI + 0x10)
                    );
  return bVar1;
}

Assistant:

btScalar AiN_times_qN (int i, btScalar *q) const { return btLargeDot (BTAROW(i)+m_nC, q+m_nC, m_nN); }